

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void biffread(bifcxdef *ctx,int argc)

{
  uchar **ppuVar1;
  uchar uVar2;
  runcxdef *prVar3;
  bool bVar4;
  bool bVar5;
  FILE *__stream;
  size_t sVar6;
  char *pcVar7;
  uchar *puVar8;
  uint16_t tmp;
  uint16_t tmp_1;
  uchar *puVar9;
  ulong uVar10;
  char typ;
  uint local_154;
  runsdef val;
  int bin_mode;
  char buf [32];
  
  __stream = (FILE *)bif_get_file(ctx,(int *)0x0,&bin_mode);
  if (bin_mode != 0) {
    sVar6 = fread(&typ,1,1,__stream);
    if (sVar6 == 1) {
      if (typ == '\b') {
        val.runstyp = '\b';
        runpush(ctx->bifcxrun,8,&val);
        return;
      }
      if (typ == '\x03') {
        sVar6 = fread(buf,2,1,__stream);
        if (sVar6 == 1) {
          prVar3 = ctx->bifcxrun;
          puVar9 = prVar3->runcxhp;
          if ((uint)(*(int *)&prVar3->runcxhtop - (int)puVar9) <= (buf._0_4_ & 0xffff)) {
            runhcmp(prVar3,buf._0_4_ & 0xffff,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
            puVar9 = ctx->bifcxrun->runcxhp;
          }
          sVar6 = fread(puVar9 + 2,(ulong)(ushort)buf._0_2_ - 2,1,__stream);
          if (sVar6 == 1) {
            *(undefined2 *)ctx->bifcxrun->runcxhp = buf._0_2_;
            val.runstyp = '\x03';
            val.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
            ctx->bifcxrun->runcxhp = val.runsv.runsvstr + (ushort)buf._0_2_;
LAB_00125244:
            runrepush(ctx->bifcxrun,&val);
            return;
          }
        }
      }
      else if ((typ == '\x01') && (sVar6 = fread(buf,4,1,__stream), sVar6 == 1)) {
        runpnum(ctx->bifcxrun,(long)(int)buf._0_4_);
        return;
      }
    }
LAB_001252e7:
    runpnil(ctx->bifcxrun);
    return;
  }
  prVar3 = ctx->bifcxrun;
  val.runsv = (anon_union_8_4_1dda36f5_for_runsv)prVar3->runcxhp;
  if ((uint)(*(int *)&prVar3->runcxhtop - (int)val.runsv.runsvnum) < 0x203) {
    runhcmp(prVar3,0x202,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
    val.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
  }
  val.runstyp = '\x03';
  puVar9 = (uchar *)(val.runsv.runsvnum + 2);
  bVar4 = false;
  local_154 = 0x202;
LAB_0012512f:
  bVar5 = !bVar4;
LAB_00125134:
  if (bVar5) {
    pcVar7 = fgets(buf,0x100,__stream);
    if (pcVar7 != (char *)0x0) {
      bVar4 = false;
      puVar8 = (uchar *)buf;
      do {
        uVar2 = *puVar8;
        if (uVar2 == '\t') {
          puVar9[0] = '\\';
          puVar9[1] = 't';
LAB_001251a2:
          puVar9 = puVar9 + 1;
        }
        else if ((uVar2 == '\n') || (uVar2 == '\r')) {
          puVar9[0] = '\\';
          puVar9[1] = 'n';
          puVar9 = puVar9 + 1;
          bVar4 = true;
        }
        else {
          if (uVar2 == '\\') {
            puVar9[0] = '\\';
            puVar9[1] = '\\';
            goto LAB_001251a2;
          }
          if (uVar2 == '\0') goto LAB_001251ad;
          *puVar9 = uVar2;
        }
        puVar8 = puVar8 + 1;
        puVar9 = puVar9 + 1;
      } while( true );
    }
    goto LAB_001252e7;
  }
  *(short *)val.runsv.runsvstr = (short)((long)puVar9 - (long)val.runsv);
  ppuVar1 = &ctx->bifcxrun->runcxhp;
  *ppuVar1 = *ppuVar1 + ((long)puVar9 - (long)val.runsv & 0xffffffff);
  goto LAB_00125244;
LAB_001251ad:
  bVar5 = false;
  if (!bVar4) goto code_r0x001251b3;
  goto LAB_00125134;
code_r0x001251b3:
  local_154 = local_154 + 0x202;
  uVar10 = (long)puVar9 - (long)val.runsv;
  *(short *)val.runsv.runsvstr = (short)uVar10;
  prVar3 = ctx->bifcxrun;
  puVar9 = prVar3->runcxhp;
  if ((uint)(*(int *)&prVar3->runcxhtop - (int)puVar9) <= local_154) {
    runhcmp(prVar3,local_154,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
    puVar9 = ctx->bifcxrun->runcxhp;
  }
  uVar10 = uVar10 & 0xffffffff;
  if ((uchar *)val.runsv.runsvnum != puVar9) {
    memmove(puVar9,val.runsv.runsvstr,uVar10);
    val.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
  }
  puVar9 = val.runsv.runsvstr + uVar10;
  goto LAB_0012512f;
}

Assistant:

void biffread(bifcxdef *ctx, int argc)
{
    osfildef *fp;
    char      typ;
    char      buf[32];
    runsdef   val;
    ushort    len;
    int       bin_mode;

    /* get the file pointer */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, (int *)0, &bin_mode);

    if (bin_mode)
    {
        /* binary file - read the type byte */
        if (osfrb(fp, &typ, 1))
            goto ret_error;
        
        /* read the data according to the type */
        switch(typ)
        {
        case DAT_NUMBER:
            if (osfrb(fp, buf, 4))
                goto ret_error;
            runpnum(ctx->bifcxrun, osrp4s(buf));
            break;
            
        case DAT_SSTRING:
            /* get the size */
            if (osfrb(fp, buf, 2))
                goto ret_error;
            len = osrp2(buf);
            
            /* reserve space */
            runhres(ctx->bifcxrun, len, 0);
            
            /* read the string into the reserved space */
            if (osfrb(fp, ctx->bifcxrun->runcxhp + 2, len - 2))
                goto ret_error;
            
            /* set up the string */
            oswp2(ctx->bifcxrun->runcxhp, len);
            val.runstyp = DAT_SSTRING;
            val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
            
            /* consume the space */
            ctx->bifcxrun->runcxhp += len;
            
            /* push the value */
            runrepush(ctx->bifcxrun, &val);
            break;
            
        case DAT_TRUE:
            val.runstyp = DAT_TRUE;
            runpush(ctx->bifcxrun, DAT_TRUE, &val);
            break;
            
        default:
            goto ret_error;
        }
    }
    else
    {
        uchar  buf[257];
        uchar *dst;
        uchar *src;
        uint   len;
        uint   res_total;
        int    found_nl;

        /* 
         *   reserve some space in the heap - we'll initially reserve
         *   space for twice our buffer, in case every single character
         *   needs to be expanded into an escape sequence
         */
        res_total = sizeof(buf) * 2;
        runhres(ctx->bifcxrun, res_total, 0);

        /* set up our output value */
        val.runstyp = DAT_SSTRING;
        val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
        dst = ctx->bifcxrun->runcxhp + 2;

        /* keep going until we find a newline or run out of data */
        for (found_nl = FALSE ; !found_nl ; )
        {
            /* text-mode - read the result into our buffer */
            if (!osfgets((char *)buf, sizeof(buf) - 1, fp))
            {
                /* 
                 *   if we found a newline, return what we have;
                 *   otherwise, return an error 
                 */
                if (found_nl)
                    break;
                else
                    goto ret_error;
            }
            
            /* 
             *   make sure it's null-terminated, in case the buffer was
             *   full 
             */
            buf[256] = '\0';
            
            /* translate into the heap area we've reserved */
            for (src = buf ; *src != '\0' ; ++src, ++dst)
            {
                /* determine if we need translations */
                switch(*src)
                {
                case '\n':
                case '\r':
                    /* translate to a newline sequence */
                    *dst++ = '\\';
                    *dst = 'n';
                    
                    /* note that we've found our newline */
                    found_nl = TRUE;
                    break;
                    
                case '\t':
                    /* translate to a tab sequence */
                    *dst++ = '\\';
                    *dst = 't';
                    break;
                    
                case '\\':
                    /* expand to a double-backslash sequence */
                    *dst++ = '\\';
                    *dst = '\\';
                    break;

                default:
                    /* leave other characters intact */
                    *dst = *src;
                    break;
                }
            }

            /*
             *   If we didn't find the newline, we'll need more space.
             *   This is a bit tricky, because the space we've already set
             *   up may move if we compact the heap while asking for more
             *   space.  So, remember our current length, reserve another
             *   buffer-full of space, and set everything up at the new
             *   output location if necessary.  
             */
            if (!found_nl)
            {
                /* reserve another buffer-full (double for expansion) */
                res_total += sizeof(buf) * 2;

                /* note our current offset */
                len = dst - val.runsv.runsvstr;
                oswp2(val.runsv.runsvstr, len);

                /* ask for the space */
                runhres(ctx->bifcxrun, res_total, 0);

                /* 
                 *   Since we were at the top of the heap before, we
                 *   should still be at the top of the heap.  If not,
                 *   we'll have to copy from our old location to the new
                 *   top of the heap.  
                 */
                if (val.runsv.runsvstr != ctx->bifcxrun->runcxhp)
                {
                    /* copy our existing text to our new location */
                    memmove(ctx->bifcxrun->runcxhp, val.runsv.runsvstr, len);

                    /* fix up our pointer */
                    val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
                }

                /* re-establish our output pointer at our new location */
                dst = val.runsv.runsvstr + len;
            }
        }

        /* finish setting up the string */
        len = dst - val.runsv.runsvstr;
        oswp2(val.runsv.runsvstr, len);

        /* consume the space */
        ctx->bifcxrun->runcxhp += len;

        /* push the value */
        runrepush(ctx->bifcxrun, &val);
    }

    /* success - we've already pushed the return value */
    return;

ret_error:
    runpnil(ctx->bifcxrun);
}